

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  TestInfo *pTVar1;
  InternalRunDeathTestFlag *pIVar2;
  int iVar3;
  int iVar4;
  TestRole TVar5;
  UnitTestImpl *pUVar6;
  int *piVar7;
  void *__addr;
  undefined8 extraout_RAX;
  long lVar8;
  size_t __len;
  allocator<char> local_301;
  bool result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  int pipe_fd [2];
  int death_test_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  Arguments args;
  string local_1d0;
  ExecDeathTestArgs args_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  sigaction ignore_sigprof_action;
  string internal_flag;
  string filter_flag;
  
  pUVar6 = GetUnitTestImpl();
  pTVar1 = pUVar6->current_test_info_;
  pIVar2 = (pUVar6->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  death_test_index = (pTVar1->result_).death_test_count_;
  if (pIVar2 == (InternalRunDeathTestFlag *)0x0) {
    iVar3 = pipe(pipe_fd);
    if (iVar3 == -1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c0,"CHECK failed: File ",(allocator<char> *)&local_240);
      std::operator+(&local_2a0,&local_2c0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     &local_2a0,", line ");
      local_260._M_dataplus._M_p._0_4_ = 0x589;
      StreamableToString<int>(&local_280,(int *)&local_260);
      std::operator+(&local_2e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     &local_280);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ignore_sigprof_action,&local_2e0,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ignore_sigprof_action,"pipe(pipe_fd) != -1");
      DeathTestAbort((string *)&args_1);
    }
    else {
      iVar3 = fcntl(pipe_fd[1],2,0);
      if (iVar3 != -1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c0,"--",(allocator<char> *)&local_280);
        std::operator+(&local_2a0,&local_2c0,"gtest_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       &local_2a0,"filter");
        std::operator+(&local_2e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       "=");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ignore_sigprof_action,&local_2e0,(pTVar1->test_suite_name_)._M_dataplus._M_p
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ignore_sigprof_action,".");
        std::operator+(&filter_flag,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                       (pTVar1->name_)._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&args_1);
        std::__cxx11::string::~string((string *)&ignore_sigprof_action);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)&result);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"--",&local_301);
        std::operator+(&local_240,&local_210,"gtest_");
        std::operator+(&local_260,&local_240,"internal_run_death_test");
        std::operator+(&local_280,&local_260,"=");
        std::operator+(&local_2c0,&local_280,this->file_);
        std::operator+(&local_2a0,&local_2c0,"|");
        StreamableToString<int>((string *)&args,&this->line_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       &local_2a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args);
        std::operator+(&local_2e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       "|");
        StreamableToString<int>((string *)&args_2,&death_test_index);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ignore_sigprof_action,&local_2e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_2)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ignore_sigprof_action,"|");
        StreamableToString<int>(&local_1d0,pipe_fd + 1);
        std::operator+(&internal_flag,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                       &local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&args_1);
        std::__cxx11::string::~string((string *)&ignore_sigprof_action);
        std::__cxx11::string::~string((string *)&args_2);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)&result);
        std::__cxx11::string::~string((string *)&args);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_210);
        Arguments::Arguments(&args);
        GetInjectableArgvs_abi_cxx11_();
        Arguments::AddArguments<std::__cxx11::string>(&args,&args_1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&args_1);
        Arguments::AddArgument(&args,filter_flag._M_dataplus._M_p);
        Arguments::AddArgument(&args,internal_flag._M_dataplus._M_p);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&args_1,"",(allocator<char> *)&ignore_sigprof_action);
        DeathTest::set_last_death_test_message((string *)&args_1);
        std::__cxx11::string::~string((string *)&args_1);
        CaptureStderr();
        FlushInfoLog();
        args_2.argv = args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
        args_2.close_fd = pipe_fd[0];
        memset((sigaction *)&ignore_sigprof_action,0,0x98);
        sigemptyset((sigset_t *)&ignore_sigprof_action.sa_mask);
        ignore_sigprof_action.__sigaction_handler =
             (anon_union_8_2_5ad2d23e_for___sigaction_handler)0x1;
        do {
          iVar3 = sigaction(0x1b,(sigaction *)&ignore_sigprof_action,(sigaction *)&args_1);
          if (iVar3 != -1) goto LAB_00121754;
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_240,"CHECK failed: File ",&local_301);
        std::operator+(&local_260,&local_240,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_280,&local_260,", line ");
        local_1d0._M_dataplus._M_p._0_4_ = 0x546;
        StreamableToString<int>(&local_210,(int *)&local_1d0);
        std::operator+(&local_2c0,&local_280,&local_210);
        std::operator+(&local_2a0,&local_2c0,": ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       &local_2a0,
                       "sigaction( SIGPROF, &ignore_sigprof_action, &saved_sigprof_action)");
        std::operator+(&local_2e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       " != -1");
        DeathTestAbort(&local_2e0);
LAB_00121754:
        if (FLAGS_gtest_death_test_use_fork != '\0') {
          iVar3 = fork();
          if (iVar3 == 0) goto LAB_00121c73;
          goto LAB_00121805;
        }
        if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') goto LAB_00121c80;
        goto LAB_0012177f;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"CHECK failed: File ",(allocator<char> *)&local_240);
    std::operator+(&local_2a0,&local_2c0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_2a0,", line ");
    local_260._M_dataplus._M_p._0_4_ = 0x58c;
    StreamableToString<int>(&local_280,(int *)&local_260);
    std::operator+(&local_2e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_280);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action,&local_2e0,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action,"fcntl(pipe_fd[1], F_SETFD, 0) != -1");
    DeathTestAbort((string *)&args_1);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,"CHECK failed: File ",(allocator<char> *)&local_1d0);
      std::operator+(&local_280,&local_260,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_2c0,&local_280,", line ");
      local_210._M_dataplus._M_p._0_4_ = 0x574;
      StreamableToString<int>(&local_240,(int *)&local_210);
      std::operator+(&local_2a0,&local_2c0,&local_240);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     &local_2a0,": ");
      std::operator+(&local_2e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     "child_pid != -1");
      DeathTestAbort(&local_2e0);
LAB_00121c73:
      ExecDeathTestChildMain(&args_2);
LAB_00121c80:
      iVar3 = __cxa_guard_acquire();
      if (iVar3 != 0) {
        StackLowerThanAddress(&local_2e0,&result);
        ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down = result;
        __cxa_guard_release();
      }
LAB_0012177f:
      iVar3 = getpagesize();
      __len = (size_t)(iVar3 * 2);
      __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
      if (__addr == (void *)0xffffffffffffffff) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,"CHECK failed: File ",(allocator<char> *)&local_1d0);
        std::operator+(&local_280,&local_260,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_2c0,&local_280,", line ");
        local_210._M_dataplus._M_p._0_4_ = 0x552;
        StreamableToString<int>(&local_240,(int *)&local_210);
        std::operator+(&local_2a0,&local_2c0,&local_240);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       &local_2a0,": ");
        std::operator+(&local_2e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       "stack != MAP_FAILED");
        DeathTestAbort(&local_2e0);
LAB_00121d79:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,"CHECK failed: File ",(allocator<char> *)&local_1d0);
        std::operator+(&local_280,&local_260,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_2c0,&local_280,", line ");
        local_210._M_dataplus._M_p._0_4_ = 0x560;
        StreamableToString<int>(&local_240,(int *)&local_210);
        std::operator+(&local_2a0,&local_2c0,&local_240);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       &local_2a0,": ");
        std::operator+(&local_2e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       "static_cast<size_t>(stack_size) > kMaxStackAlignment && reinterpret_cast<uintptr_t>(stack_top) % kMaxStackAlignment == 0"
                      );
        DeathTestAbort(&local_2e0);
LAB_00121e32:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,"CHECK failed: File ",(allocator<char> *)&local_1d0);
        std::operator+(&local_280,&local_260,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_2c0,&local_280,", line ");
        local_210._M_dataplus._M_p._0_4_ = 0x564;
        StreamableToString<int>(&local_240,(int *)&local_210);
        std::operator+(&local_2a0,&local_2c0,&local_240);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       &local_2a0,": ");
        std::operator+(&local_2e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       "munmap(stack, stack_size) != -1");
        DeathTestAbort(&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)&result);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_260);
        Arguments::~Arguments(&args);
        std::__cxx11::string::~string((string *)&internal_flag);
        std::__cxx11::string::~string((string *)&filter_flag);
        _Unwind_Resume(extraout_RAX);
      }
      lVar8 = 0;
      if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
        lVar8 = __len - 0x40;
      }
      if (((uint)(iVar3 * 2) < 0x41) || (((ulong)(lVar8 + (long)__addr) & 0x3f) != 0))
      goto LAB_00121d79;
      iVar3 = clone(ExecDeathTestChildMain,(void *)(lVar8 + (long)__addr),0x11,&args_2);
      iVar4 = munmap(__addr,__len);
      if (iVar4 == -1) goto LAB_00121e32;
LAB_00121805:
      do {
        iVar4 = sigaction(0x1b,(sigaction *)&args_1,(sigaction *)0x0);
        if (iVar4 != -1) goto LAB_00121903;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,"CHECK failed: File ",&local_301);
      std::operator+(&local_260,&local_240,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_280,&local_260,", line ");
      local_1d0._M_dataplus._M_p._0_4_ = 0x571;
      StreamableToString<int>(&local_210,(int *)&local_1d0);
      std::operator+(&local_2c0,&local_280,&local_210);
      std::operator+(&local_2a0,&local_2c0,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     &local_2a0,"sigaction(SIGPROF, &saved_sigprof_action, nullptr)");
      std::operator+(&local_2e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     " != -1");
      DeathTestAbort(&local_2e0);
LAB_00121903:
    } while (iVar3 == -1);
    do {
      iVar4 = close(pipe_fd[1]);
      if (iVar4 != -1) goto LAB_00121a00;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"CHECK failed: File ",(allocator<char> *)&local_210);
    std::operator+(&local_2c0,&local_280,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_2a0,&local_2c0,", line ");
    local_240._M_dataplus._M_p._0_4_ = 0x5a3;
    StreamableToString<int>(&local_260,(int *)&local_240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_2a0,&local_260);
    std::operator+(&local_2e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,": "
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action,&local_2e0,"close(pipe_fd[1])");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action," != -1");
    DeathTestAbort((string *)&args_1);
LAB_00121a00:
    *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar3;
    (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = pipe_fd[0];
    (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
    Arguments::~Arguments(&args);
    std::__cxx11::string::~string((string *)&internal_flag);
    std::__cxx11::string::~string((string *)&filter_flag);
    TVar5 = OVERSEE_TEST;
  }
  else {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar2->write_fd_;
    TVar5 = EXECUTE_TEST;
  }
  return TVar5;
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  kFilterFlag + "=" + info->test_suite_name() +
                                  "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}